

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

AbstractStreamReader *
METADemuxer::createCodec
          (string *codecName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *addParams,string *codecStreamName,
          vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *mplsInfo)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  long *plVar4;
  double dVar5;
  bool bVar6;
  uint8_t uVar7;
  char cVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  PipCorner PVar11;
  uint uVar12;
  uint uVar13;
  int32_t iVar14;
  int iVar15;
  VideoAspectRatio VVar16;
  uint32_t uVar17;
  LPCMStreamReader *this;
  const_iterator cVar18;
  long lVar19;
  SimplePacketizerReader *this_00;
  _Base_ptr p_Var20;
  undefined4 *puVar21;
  ostream *poVar22;
  char *str;
  LPCMStreamReader *pLVar23;
  undefined4 uVar24;
  float fVar25;
  undefined4 uVar26;
  double local_288;
  Font font;
  double local_238;
  ostringstream ss;
  uint *local_b0;
  undefined8 local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  string secondStr;
  uint *local_70;
  undefined8 local_68;
  uint local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  uint *local_50;
  undefined8 local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  bVar6 = std::operator==(codecName,"V_MPEG4/ISO/AVC");
  if ((bVar6) || (bVar6 = std::operator==(codecName,"V_MPEG4/ISO/MVC"), bVar6)) {
    this = (LPCMStreamReader *)operator_new(0x250);
    H264StreamReader::H264StreamReader((H264StreamReader *)this);
    bVar6 = std::operator==(codecName,"V_MPEG4/ISO/MVC");
    if (bVar6) {
      this->m_tmpFrameBuffer[0x113] = '\x01';
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"fps",(allocator<char> *)&font)
    ;
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,(key_type *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      dVar5 = strToDouble(*(char **)(cVar18._M_node + 2));
      dVar5 = correctFps(dVar5);
      lVar19 = 0;
      if (0.0 < dVar5) {
        lVar19 = (long)(5292000000.0 / dVar5);
      }
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar5;
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame = lVar19;
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField = lVar19 / 2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"delPulldown",(allocator<char> *)&font);
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,(key_type *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_removePulldown = true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"level",(allocator<char> *)&font);
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,(key_type *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      pLVar23 = (LPCMStreamReader *)0x0;
      if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
          super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader ==
          (_func_int **)&PTR__H264StreamReader_0024a7a0) {
        pLVar23 = this;
      }
      dVar5 = strToDouble(*(char **)(cVar18._M_node + 2));
      pLVar23->m_tmpFrameBuffer[0x21] = (char)(int)dVar5 * '\n';
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"insertSEI",(allocator<char> *)&font);
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,(key_type *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x45] = '\x01';
      this->m_tmpFrameBuffer[0x46] = '\0';
      this->m_tmpFrameBuffer[0x47] = '\0';
      this->m_tmpFrameBuffer[0x48] = '\0';
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"autoSEI",(allocator<char> *)&font);
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,(key_type *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x45] = '\x01';
      this->m_tmpFrameBuffer[0x46] = '\0';
      this->m_tmpFrameBuffer[0x47] = '\0';
      this->m_tmpFrameBuffer[0x48] = '\0';
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"forceSEI",(allocator<char> *)&font);
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,(key_type *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x45] = '\x02';
      this->m_tmpFrameBuffer[0x46] = '\0';
      this->m_tmpFrameBuffer[0x47] = '\0';
      this->m_tmpFrameBuffer[0x48] = '\0';
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"contSPS",(allocator<char> *)&font);
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,(key_type *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
      this->m_tmpFrameBuffer[0x11] = '\x01';
    }
  }
  else {
    bVar6 = std::operator==(codecName,"V_MPEGH/ISO/HEVC");
    if (bVar6) {
      this = (LPCMStreamReader *)operator_new(0x198);
      HEVCStreamReader::HEVCStreamReader((HEVCStreamReader *)this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"fps",(allocator<char> *)&font);
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&addParams->_M_t,(key_type *)&ss);
    }
    else {
      bVar6 = std::operator==(codecName,"V_MPEGI/ISO/VVC");
      if (!bVar6) {
        bVar6 = std::operator==(codecName,"V_MS/VFW/WVC1");
        if (bVar6) {
          this = (LPCMStreamReader *)operator_new(0x1f8);
          VC1StreamReader::VC1StreamReader((VC1StreamReader *)this);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"fps",(allocator<char> *)&font);
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,(key_type *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          if ((_Rb_tree_header *)cVar18._M_node != &(addParams->_M_t)._M_impl.super__Rb_tree_header)
          {
            dVar5 = strToDouble(*(char **)(cVar18._M_node + 2));
            dVar5 = correctFps(dVar5);
            lVar19 = 0;
            if (0.0 < dVar5) {
              lVar19 = (long)(5292000000.0 / dVar5);
            }
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar5;
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame = lVar19;
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField = lVar19 / 2
            ;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"delPulldown",(allocator<char> *)&font);
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,(key_type *)&ss);
        }
        else {
          bVar6 = std::operator==(codecName,"V_MPEG-2");
          if (!bVar6) {
            bVar6 = std::operator==(codecName,"A_AAC");
            if (bVar6) {
              this = (LPCMStreamReader *)operator_new(0xf8);
              memset(this,0,0xf8);
              AACStreamReader::AACStreamReader((AACStreamReader *)this);
            }
            else {
              bVar6 = std::operator==(codecName,"A_MP3");
              if (bVar6) {
                this = (LPCMStreamReader *)operator_new(0xf8);
                memset(this,0,0xf8);
                MpegAudioStreamReader::MpegAudioStreamReader((MpegAudioStreamReader *)this);
              }
              else {
                bVar6 = std::operator==(codecName,"S_SUP");
                if (bVar6) {
                  this = (LPCMStreamReader *)operator_new(0x100);
                  DVBSubStreamReader::DVBSubStreamReader((DVBSubStreamReader *)this);
                }
                else {
                  bVar6 = std::operator==(codecName,"A_LPCM");
                  if (bVar6) {
                    this = (LPCMStreamReader *)operator_new(0x4490);
                    LPCMStreamReader::LPCMStreamReader(this);
                  }
                  else {
                    bVar6 = std::operator==(codecName,"A_MLP");
                    if (bVar6) {
                      this = (LPCMStreamReader *)operator_new(0x100);
                      MLPStreamReader::MLPStreamReader((MLPStreamReader *)this);
                    }
                    else {
                      bVar6 = std::operator==(codecName,"A_DTS");
                      if (bVar6) {
                        this = (LPCMStreamReader *)operator_new(0x150);
                        DTSStreamReader::DTSStreamReader((DTSStreamReader *)this);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&ss,"down-to-dts",(allocator<char> *)&font);
                        cVar18 = std::
                                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::find(&addParams->_M_t,(key_type *)&ss);
                        std::__cxx11::string::~string((string *)&ss);
                        if ((_Rb_tree_header *)cVar18._M_node !=
                            &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
                          this->m_tmpFrameBuffer[7] = '\x01';
                        }
                      }
                      else {
                        bVar6 = std::operator==(codecName,"A_AC3");
                        if (bVar6) {
                          this = (LPCMStreamReader *)operator_new(0x1c8);
                          AC3StreamReader::AC3StreamReader((AC3StreamReader *)this);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&ss,"down-to-ac3",(allocator<char> *)&font);
                          cVar18 = std::
                                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::find(&addParams->_M_t,(key_type *)&ss);
                          std::__cxx11::string::~string((string *)&ss);
                          if ((_Rb_tree_header *)cVar18._M_node !=
                              &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
                            this->m_tmpFrameBuffer[6] = '\x01';
                          }
                        }
                        else {
                          bVar6 = std::operator==(codecName,"S_HDMV/PGS");
                          if (bVar6) {
                            this = (LPCMStreamReader *)operator_new(0x1e8);
                            PGSStreamReader::PGSStreamReader((PGSStreamReader *)this);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&ss,"bottom-offset",(allocator<char> *)&font);
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::find(&addParams->_M_t,(key_type *)&ss);
                            std::__cxx11::string::~string((string *)&ss);
                            p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
                            if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
                              pLVar23 = (LPCMStreamReader *)0x0;
                              if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                                  super_AbstractStreamReader).super_BaseAbstractStreamReader.
                                  _vptr_BaseAbstractStreamReader ==
                                  (_func_int **)&PTR__PGSStreamReader_0024c208) {
                                pLVar23 = this;
                              }
                              iVar14 = strToInt32(*(char **)(cVar18._M_node + 2));
                              *(int32_t *)(*(long *)(pLVar23->m_tmpFrameBuffer + 0x69) + 0xc) =
                                   iVar14;
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&ss,"3d-plane",(allocator<char> *)&font);
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::find(&addParams->_M_t,(key_type *)&ss);
                            std::__cxx11::string::~string((string *)&ss);
                            if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
                              pLVar23 = (LPCMStreamReader *)0x0;
                              if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                                  super_AbstractStreamReader).super_BaseAbstractStreamReader.
                                  _vptr_BaseAbstractStreamReader ==
                                  (_func_int **)&PTR__PGSStreamReader_0024c208) {
                                pLVar23 = this;
                              }
                              uVar7 = strToInt8u(*(char **)(cVar18._M_node + 2));
                              pLVar23->m_tmpFrameBuffer[0xff] = uVar7;
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&ss,"fps",(allocator<char> *)&font);
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::find(&addParams->_M_t,(key_type *)&ss);
                            std::__cxx11::string::~string((string *)&ss);
                            if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
                              uVar24 = 0;
                              uVar26 = 0;
                            }
                            else {
                              dVar5 = strToDouble(*(char **)(cVar18._M_node + 2));
                              uVar24 = SUB84(dVar5,0);
                              uVar26 = (undefined4)((ulong)dVar5 >> 0x20);
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&ss,"video-width",(allocator<char> *)&font);
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::find(&addParams->_M_t,(key_type *)&ss);
                            std::__cxx11::string::~string((string *)&ss);
                            if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
                              uVar9 = 0;
                            }
                            else {
                              uVar9 = strToInt16u(*(char **)(cVar18._M_node + 2));
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&ss,"video-height",(allocator<char> *)&font);
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::find(&addParams->_M_t,(key_type *)&ss);
                            std::__cxx11::string::~string((string *)&ss);
                            if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
                              uVar10 = 0;
                            }
                            else {
                              uVar10 = strToInt16u(*(char **)(cVar18._M_node + 2));
                            }
                            PGSStreamReader::setVideoInfo
                                      ((PGSStreamReader *)this,uVar9,uVar10,
                                       (double)CONCAT44(uVar26,uVar24));
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&ss,"font-border",(allocator<char> *)&font);
                            cVar18 = std::
                                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::find(&addParams->_M_t,(key_type *)&ss);
                            std::__cxx11::string::~string((string *)&ss);
                            if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
                              pLVar23 = (LPCMStreamReader *)0x0;
                              if ((((MPEGStreamReader *)&this->super_SimplePacketizerReader)->
                                  super_AbstractStreamReader).super_BaseAbstractStreamReader.
                                  _vptr_BaseAbstractStreamReader ==
                                  (_func_int **)&PTR__PGSStreamReader_0024c208) {
                                pLVar23 = this;
                              }
                              iVar14 = strToInt32(*(char **)(cVar18._M_node + 2));
                              *(int32_t *)
                               ((long)&((MPEGStreamReader *)&pLVar23->super_SimplePacketizerReader)
                                       ->m_testPulldownDts + 4) = iVar14;
                            }
                          }
                          else {
                            bVar6 = std::operator==(codecName,"S_TEXT/UTF8");
                            if (!bVar6) {
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
                              poVar22 = std::operator<<((ostream *)&ss,"Unsupported codec ");
                              std::operator<<(poVar22,(string *)codecName);
                              puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
                              std::__cxx11::stringbuf::str();
                              *puVar21 = 0x1f5;
                              *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
                              if (local_70 == &local_60) {
                                puVar21[6] = local_60;
                                puVar21[7] = uStack_5c;
                                puVar21[8] = uStack_58;
                                puVar21[9] = uStack_54;
                              }
                              else {
                                *(uint **)(puVar21 + 2) = local_70;
                                *(ulong *)(puVar21 + 6) = CONCAT44(uStack_5c,local_60);
                              }
                              *(undefined8 *)(puVar21 + 4) = local_68;
                              local_60 = local_60 & 0xffffff00;
                              __cxa_throw(puVar21,&VodCoreException::typeinfo,
                                          VodCoreException::~VodCoreException);
                            }
                            this = (LPCMStreamReader *)operator_new(0x188);
                            SRTStreamReader::SRTStreamReader((SRTStreamReader *)this);
                            font.m_name._M_dataplus._M_p = (pointer)&font.m_name.field_2;
                            font.m_name._M_string_length = 0;
                            font.m_name.field_2._M_local_buf[0] = '\0';
                            font.m_size = 0x12;
                            font.m_opts = 0;
                            font.m_borderWidth = 0.0;
                            font.m_charset = 0;
                            secondStr._M_dataplus._M_p = (pointer)0x0;
                            font.m_color = 0xffffff;
                            font.m_lineSpacing = 1.0;
                            p_Var20 = (addParams->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                      _M_left;
                            local_238 = 0.0;
                            uVar10 = 0;
                            uVar9 = 0;
                            for (; (_Rb_tree_header *)p_Var20 !=
                                   &(addParams->_M_t)._M_impl.super__Rb_tree_header;
                                p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
                              p_Var3 = p_Var20 + 1;
                              bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"font-name");
                              if (bVar6) {
                                unquoteStr((string *)&ss,(string *)(p_Var20 + 2));
                                std::__cxx11::string::operator=((string *)&font,(string *)&ss);
                                std::__cxx11::string::~string((string *)&ss);
                              }
                              else {
                                bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"font-size");
                                if (bVar6) {
                                  iVar14 = strToInt32(*(char **)(p_Var20 + 2));
                                  font.m_size = iVar14;
                                }
                                else {
                                  bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"font-bold");
                                  if (bVar6) {
                                    font._32_8_ = font._32_8_ | 0x100000000;
                                  }
                                  else {
                                    bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"font-italic");
                                    if (bVar6) {
                                      font._32_8_ = font._32_8_ | 0x200000000;
                                    }
                                    else {
                                      bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"font-underline");
                                      if (bVar6) {
                                        font._32_8_ = font._32_8_ | 0x400000000;
                                      }
                                      else {
                                        bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"font-strike-out");
                                        if (bVar6) {
                                          font._32_8_ = font._32_8_ | 0x800000000;
                                        }
                                        else {
                                          bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"font-color");
                                          if (bVar6) {
                                            p_Var3 = p_Var20 + 2;
                                            if (p_Var20[2]._M_parent < (_Base_ptr)0x2) {
                                              str = *(char **)p_Var3;
                                              if (p_Var20[2]._M_parent != (_Base_ptr)0x0) {
                                                cVar8 = *str;
                                                goto LAB_001b583a;
                                              }
LAB_001b586b:
                                              uVar17 = strToInt32u(str,10);
                                              font.m_color = uVar17;
                                            }
                                            else {
                                              str = *(char **)p_Var3;
                                              cVar8 = *str;
                                              if (cVar8 == '0') {
                                                if (str[1] != 'x') goto LAB_001b586b;
                                                std::__cxx11::string::substr
                                                          ((ulong)&ss,(ulong)p_Var3);
                                                uVar17 = strToInt32u(_ss,0x10);
                                              }
                                              else {
LAB_001b583a:
                                                if (cVar8 != 'x') goto LAB_001b586b;
                                                std::__cxx11::string::substr
                                                          ((ulong)&ss,(ulong)p_Var3);
                                                uVar17 = strToInt32u(_ss,0x10);
                                              }
                                              font.m_color = uVar17;
                                              std::__cxx11::string::~string((string *)&ss);
                                              uVar17 = font.m_color;
                                            }
                                            if (uVar17 < 0x1000000) {
                                              font._48_8_ = CONCAT44(font.m_lineSpacing,uVar17) |
                                                            0xff000000;
                                            }
                                          }
                                          else {
                                            bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"line-spacing");
                                            if (bVar6) {
                                              fVar25 = strToFloat(*(char **)(p_Var20 + 2));
                                              font.m_lineSpacing = fVar25;
                                            }
                                            else {
                                              bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"font-charset");
                                              if (bVar6) {
                                                uVar17 = strToInt32(*(char **)(p_Var20 + 2));
                                                font.m_charset = uVar17;
                                              }
                                              else {
                                                bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"font-border");
                                                if (bVar6) {
                                                  fVar25 = strToFloat(*(char **)(p_Var20 + 2));
                                                  font.m_borderWidth = fVar25;
                                                }
                                                else {
                                                  bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"fps");
                                                  if (bVar6) {
                                                    local_238 = strToDouble(*(char **)(p_Var20 + 2))
                                                    ;
                                                  }
                                                  else {
                                                    bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"video-width");
                                                  if (bVar6) {
                                                    uVar9 = strToInt16u(*(char **)(p_Var20 + 2));
                                                  }
                                                  else {
                                                    bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"video-height");
                                                  if (bVar6) {
                                                    uVar10 = strToInt16u(*(char **)(p_Var20 + 2));
                                                  }
                                                  else {
                                                    bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"bottom-offset");
                                                  if (bVar6) {
                                                    iVar14 = strToInt32(*(char **)(p_Var20 + 2));
                                                    *(int32_t *)
                                                     (*(long *)&((MPEGStreamReader *)
                                                                &this->super_SimplePacketizerReader)
                                                                ->m_eof + 0xc) = iVar14;
                                                  }
                                                  else {
                                                    bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"fadein-time");
                                                  if (bVar6) {
                                                    fVar25 = strToFloat(*(char **)(p_Var20 + 2));
                                                    secondStr._M_dataplus._M_p._0_4_ = fVar25;
                                                  }
                                                  else {
                                                    bVar6 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var3,"fadeout-time");
                                                  if (bVar6) {
                                                    fVar25 = strToFloat(*(char **)(p_Var20 + 2));
                                                    secondStr._M_dataplus._M_p._4_4_ = fVar25;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                            if (((uVar9 == 0) || (uVar10 == 0)) ||
                               ((local_238 == 0.0 && (!NAN(local_238))))) {
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
                              std::operator<<((ostream *)&ss,
                                              "video-width, video-height and fps parameters MUST be provided for SRT tracks"
                                             );
                              puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
                              std::__cxx11::stringbuf::str();
                              *puVar21 = 3;
                              *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
                              if (local_50 == &local_40) {
                                puVar21[6] = local_40;
                                puVar21[7] = uStack_3c;
                                puVar21[8] = uStack_38;
                                puVar21[9] = uStack_34;
                              }
                              else {
                                *(uint **)(puVar21 + 2) = local_50;
                                *(ulong *)(puVar21 + 6) = CONCAT44(uStack_3c,local_40);
                              }
                              *(undefined8 *)(puVar21 + 4) = local_48;
                              local_48 = 0;
                              local_40 = local_40 & 0xffffff00;
                              local_50 = &local_40;
                              __cxa_throw(puVar21,&VodCoreException::typeinfo,
                                          VodCoreException::~VodCoreException);
                            }
                            SRTStreamReader::setVideoInfo
                                      ((SRTStreamReader *)this,uVar9,uVar10,local_238);
                            plVar4 = (long *)**(undefined8 **)
                                               &((MPEGStreamReader *)
                                                &this->super_SimplePacketizerReader)->m_eof;
                            (**(code **)(*plVar4 + 0x10))(plVar4,&font);
                            SRTStreamReader::setAnimation
                                      ((SRTStreamReader *)this,(TextAnimation *)&secondStr);
                            std::__cxx11::string::~string((string *)&font);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_001b4dd8;
          }
          this = (LPCMStreamReader *)operator_new(600);
          MPEG2StreamReader::MPEG2StreamReader((MPEG2StreamReader *)this);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"fps",(allocator<char> *)&font);
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,(key_type *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
            dVar5 = strToDouble(*(char **)(cVar18._M_node + 2));
            dVar5 = correctFps(dVar5);
            lVar19 = 0;
            if (0.0 < dVar5) {
              lVar19 = (long)(5292000000.0 / dVar5);
            }
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar5;
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame = lVar19;
            ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField = lVar19 / 2
            ;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"ar",(allocator<char> *)&font);
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,(key_type *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
            lVar19 = __dynamic_cast(this,&AbstractStreamReader::typeinfo,&MPEGStreamReader::typeinfo
                                    ,0);
            VVar16 = arNameToCode((string *)(cVar18._M_node + 2));
            *(VideoAspectRatio *)(lVar19 + 0x58) = VVar16;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"delPulldown",(allocator<char> *)&font);
          cVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&addParams->_M_t,(key_type *)&ss);
        }
        std::__cxx11::string::~string((string *)&ss);
        if ((_Rb_tree_header *)cVar18._M_node != &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
          ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_removePulldown = true;
        }
        goto LAB_001b4dd8;
      }
      this = (LPCMStreamReader *)operator_new(400);
      VVCStreamReader::VVCStreamReader((VVCStreamReader *)this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"fps",(allocator<char> *)&font);
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&addParams->_M_t,(key_type *)&ss);
    }
    std::__cxx11::string::~string((string *)&ss);
    if ((_Rb_tree_header *)cVar18._M_node != &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
      dVar5 = strToDouble(*(char **)(cVar18._M_node + 2));
      dVar5 = correctFps(dVar5);
      lVar19 = 0;
      if (0.0 < dVar5) {
        lVar19 = (long)(5292000000.0 / dVar5);
      }
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_fps = dVar5;
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerFrame = lVar19;
      ((MPEGStreamReader *)&this->super_SimplePacketizerReader)->m_pcrIncPerField = lVar19 / 2;
    }
  }
LAB_001b4dd8:
  if (*(codecName->_M_dataplus)._M_p == 'A') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"stretch",(allocator<char> *)&font);
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&addParams->_M_t,(key_type *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    if ((_Rb_tree_header *)cVar18._M_node != &(addParams->_M_t)._M_impl.super__Rb_tree_header) {
      p_Var2 = cVar18._M_node + 2;
      lVar19 = std::__cxx11::string::find((char)p_Var2,0x2f);
      if (lVar19 == -1) {
        local_288 = strToDouble(*(char **)p_Var2);
      }
      else {
        std::__cxx11::string::substr((ulong)&font,(ulong)p_Var2);
        std::__cxx11::string::substr((ulong)&secondStr,(ulong)p_Var2);
        local_288 = strToDouble(font.m_name._M_dataplus._M_p);
        dVar5 = strToDouble(secondStr._M_dataplus._M_p);
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          std::operator<<((ostream *)&ss,"Second argument at stretch parameter can not be 0");
          puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar21 = 3;
          *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
          if (local_b0 == &local_a0) {
            puVar21[6] = local_a0;
            puVar21[7] = uStack_9c;
            puVar21[8] = uStack_98;
            puVar21[9] = uStack_94;
          }
          else {
            *(uint **)(puVar21 + 2) = local_b0;
            *(ulong *)(puVar21 + 6) = CONCAT44(uStack_9c,local_a0);
          }
          *(undefined8 *)(puVar21 + 4) = local_a8;
          local_a0 = local_a0 & 0xffffff00;
          __cxa_throw(puVar21,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        local_288 = local_288 / dVar5;
        std::__cxx11::string::~string((string *)&secondStr);
        std::__cxx11::string::~string((string *)&font);
      }
      lVar19 = __dynamic_cast(this,&AbstractStreamReader::typeinfo,&SimplePacketizerReader::typeinfo
                              ,0);
      *(double *)(lVar19 + 0x60) = local_288;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"secondary",(allocator<char> *)&font);
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  p_Var1 = &(addParams->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar18._M_node != p_Var1) {
    (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
    m_secondary = true;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"pipCorner",(allocator<char> *)&font);
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
    PVar11 = TopLeft;
  }
  else {
    PVar11 = pipCornerFromStr((string *)(cVar18._M_node + 2));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"pipHOffset",(allocator<char> *)&font);
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
    uVar12 = 0;
  }
  else {
    uVar12 = strToInt32((string *)(cVar18._M_node + 2));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"pipVOffset",(allocator<char> *)&font);
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
    uVar13 = 0;
  }
  else {
    uVar13 = strToInt32((string *)(cVar18._M_node + 2));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"pipLumma",(allocator<char> *)&font);
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
    iVar14 = 3;
  }
  else {
    iVar14 = strToInt32((string *)(cVar18._M_node + 2));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"pipScale",(allocator<char> *)&font);
  cVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&addParams->_M_t,(key_type *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  if ((_Rb_tree_header *)cVar18._M_node == p_Var1) {
    iVar15 = 1;
  }
  else {
    iVar15 = pipScaleFromStr((string *)(cVar18._M_node + 2));
  }
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.scaleIndex = iVar15;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.corner = PVar11;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.hOffset = uVar12;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.vOffset = uVar13;
  (((MPEGStreamReader *)&this->super_SimplePacketizerReader)->super_AbstractStreamReader).
  m_pipParams.lumma = iVar14;
  if (((mplsInfo->super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
       super__Vector_impl_data._M_start !=
       (mplsInfo->super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>)._M_impl.
       super__Vector_impl_data._M_finish) &&
     (this_00 = (SimplePacketizerReader *)
                __dynamic_cast(this,&AbstractStreamReader::typeinfo,
                               &SimplePacketizerReader::typeinfo,0),
     this_00 != (SimplePacketizerReader *)0x0)) {
    SimplePacketizerReader::setMPLSInfo(this_00,mplsInfo);
  }
  return (AbstractStreamReader *)this;
}

Assistant:

AbstractStreamReader* METADemuxer::createCodec(const string& codecName, const map<string, string>& addParams,
                                               const std::string& codecStreamName, const vector<MPLSPlayItem>& mplsInfo)
{
    AbstractStreamReader* rez = nullptr;
    if (codecName == "V_MPEG4/ISO/AVC" || codecName == "V_MPEG4/ISO/MVC")
    {
        auto h264Reader = new H264StreamReader();
        rez = h264Reader;
        if (codecName == "V_MPEG4/ISO/MVC")
            h264Reader->setIsSubStream(true);

        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<H264StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<H264StreamReader*>(rez)->setRemovePulldown(true);

        itr = addParams.find("level");
        if (itr != addParams.end())
            dynamic_cast<H264StreamReader*>(rez)->setForceLevel(static_cast<uint8_t>(strToDouble(itr->second.c_str())) *
                                                                10);
        itr = addParams.find("insertSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertAuto);
        }
        itr = addParams.find("autoSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertAuto);
        }
        itr = addParams.find("forceSEI");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setInsertSEI(H264StreamReader::SeiMethod::SEI_InsertForce);
        }
        itr = addParams.find("contSPS");
        if (itr != addParams.end())
        {
            dynamic_cast<H264StreamReader*>(rez)->setH264SPSCont(true);
        }
    }
    else if (codecName == "V_MPEGH/ISO/HEVC")
    {
        rez = new HEVCStreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<HEVCStreamReader*>(rez)->setFPS(fps);
        }
    }
    else if (codecName == "V_MPEGI/ISO/VVC")
    {
        rez = new VVCStreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<VVCStreamReader*>(rez)->setFPS(fps);
        }
    }
    else if (codecName == "V_MS/VFW/WVC1")
    {
        rez = new VC1StreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<VC1StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<VC1StreamReader*>(rez)->setRemovePulldown(true);
    }
    else if (codecName == "V_MPEG-2")
    {
        rez = new MPEG2StreamReader();
        auto itr = addParams.find("fps");
        if (itr != addParams.end())
        {
            double fps = strToDouble(itr->second.c_str());
            fps = correctFps(fps);
            dynamic_cast<MPEG2StreamReader*>(rez)->setFPS(fps);
        }

        itr = addParams.find("ar");
        if (itr != addParams.end())
            dynamic_cast<MPEGStreamReader*>(rez)->setAspectRatio(arNameToCode(itr->second));

        itr = addParams.find("delPulldown");
        if (itr != addParams.end())
            dynamic_cast<MPEG2StreamReader*>(rez)->setRemovePulldown(true);
    }
    else if (codecName == "A_AAC")
        rez = new AACStreamReader();
    else if (codecName == "A_MP3")
        rez = new MpegAudioStreamReader();
    else if (codecName == "S_SUP")
        rez = new DVBSubStreamReader();
    else if (codecName == "A_LPCM")
        rez = new LPCMStreamReader();
    else if (codecName == "A_MLP")
        rez = new MLPStreamReader();
    else if (codecName == "A_DTS")
    {
        rez = new DTSStreamReader();
        auto itr = addParams.find("down-to-dts");
        if (itr != addParams.end())
            dynamic_cast<DTSStreamReader*>(rez)->setDownconvertToDTS(true);
    }
    else if (codecName == "A_AC3")
    {
        rez = new AC3StreamReader();
        auto itr = addParams.find("down-to-ac3");
        if (itr != addParams.end())
            dynamic_cast<AC3StreamReader*>(rez)->setDownconvertToAC3(true);
    }
    else if (codecName == "S_HDMV/PGS")
    {
        rez = new PGSStreamReader();
        auto itr = addParams.find("bottom-offset");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setBottomOffset(strToInt32(itr->second.c_str()));

        itr = addParams.find("3d-plane");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setOffsetId(strToInt8u(itr->second.c_str()));

        double fps = 0.0;
        uint16_t width = 0;
        uint16_t height = 0;
        itr = addParams.find("fps");
        if (itr != addParams.end())
            fps = strToDouble(itr->second.c_str());
        itr = addParams.find("video-width");
        if (itr != addParams.end())
            width = strToInt16u(itr->second.c_str());
        itr = addParams.find("video-height");
        if (itr != addParams.end())
            height = strToInt16u(itr->second.c_str());
        dynamic_cast<PGSStreamReader*>(rez)->setVideoInfo(width, height, fps);
        itr = addParams.find("font-border");
        if (itr != addParams.end())
            dynamic_cast<PGSStreamReader*>(rez)->setFontBorder(strToInt32(itr->second.c_str()));
    }
    else if (codecName == "S_TEXT/UTF8")
    {
        auto srtReader = new SRTStreamReader();
        rez = srtReader;
        text_subtitles::Font font;
        uint16_t srtWidth = 0, srtHeight = 0;
        double fps = 0.0;
        text_subtitles::TextAnimation animation;
        for (const auto& addParam : addParams)
        {
            if (addParam.first == "font-name")
            {
                font.m_name = unquoteStr(addParam.second);
            }
            else if (addParam.first == "font-size")
                font.m_size = strToInt32(addParam.second.c_str());
            else if (addParam.first == "font-bold")
                font.m_opts |= text_subtitles::Font::BOLD;
            else if (addParam.first == "font-italic")
                font.m_opts |= text_subtitles::Font::ITALIC;
            else if (addParam.first == "font-underline")
                font.m_opts |= text_subtitles::Font::UNDERLINE;
            else if (addParam.first == "font-strike-out")
                font.m_opts |= text_subtitles::Font::STRIKE_OUT;
            else if (addParam.first == "font-color")
            {
                const string& s = addParam.second;
                if (s.size() >= 2 && s[0] == '0' && s[1] == 'x')
                    font.m_color = strToInt32u(s.substr(2, s.size() - 2).c_str(), 16);
                else if (!s.empty() && s[0] == 'x')
                    font.m_color = strToInt32u(s.substr(1, s.size() - 1).c_str(), 16);
                else
                    font.m_color = strToInt32u(s.c_str());
                if ((font.m_color & 0xff000000u) == 0)
                    font.m_color |= 0xff000000u;
            }
            else if (addParam.first == "line-spacing")
                font.m_lineSpacing = strToFloat(addParam.second.c_str());
            else if (addParam.first == "font-charset")
                font.m_charset = strToInt32(addParam.second.c_str());
            else if (addParam.first == "font-border")
                font.m_borderWidth = strToFloat(addParam.second.c_str());
            else if (addParam.first == "fps")
            {
                fps = strToDouble(addParam.second.c_str());
            }
            else if (addParam.first == "video-width")
                srtWidth = strToInt16u(addParam.second.c_str());
            else if (addParam.first == "video-height")
                srtHeight = strToInt16u(addParam.second.c_str());
            else if (addParam.first == "bottom-offset")
                srtReader->setBottomOffset(strToInt32(addParam.second.c_str()));
            else if (addParam.first == "fadein-time")
                animation.fadeInDuration = strToFloat(addParam.second.c_str());
            else if (addParam.first == "fadeout-time")
                animation.fadeOutDuration = strToFloat(addParam.second.c_str());
        }
        if (srtWidth == 0 || srtHeight == 0 || fps == 0.0)
            THROW(ERR_COMMON, "video-width, video-height and fps parameters MUST be provided for SRT tracks")
        srtReader->setVideoInfo(srtWidth, srtHeight, fps);
        srtReader->setFont(font);
        srtReader->setAnimation(animation);
    }
    else
        THROW(ERR_UNKNOWN_CODEC, "Unsupported codec " << codecName)

    if (codecName[0] == 'A')
    {
        auto itr = addParams.find("stretch");
        if (itr != addParams.end())
        {
            double stretch;
            size_t divPos = itr->second.find('/');
            if (divPos == std::string::npos)
                stretch = strToDouble(itr->second.c_str());
            else
            {
                string firstStr = itr->second.substr(0, divPos);
                string secondStr = itr->second.substr(divPos + 1, itr->second.size() - divPos - 1);
                double dFirst = strToDouble(firstStr.c_str());
                double dSecond = strToDouble(secondStr.c_str());
                if (dSecond != 0.0)
                    stretch = dFirst / dSecond;
                else
                    THROW(ERR_COMMON, "Second argument at stretch parameter can not be 0")
            }
            if (itr != addParams.end())
                dynamic_cast<SimplePacketizerReader*>(rez)->setStretch(stretch);
        }
    }
    auto itr = addParams.find("secondary");
    if (itr != addParams.end())
        rez->setIsSecondary(true);

    PIPParams pipParams;
    itr = addParams.find("pipCorner");
    if (itr != addParams.end())
        pipParams.corner = pipCornerFromStr(itr->second);
    itr = addParams.find("pipHOffset");
    if (itr != addParams.end())
        pipParams.hOffset = strToInt32(itr->second);
    itr = addParams.find("pipVOffset");
    if (itr != addParams.end())
        pipParams.vOffset = strToInt32(itr->second);
    itr = addParams.find("pipLumma");
    if (itr != addParams.end())
        pipParams.lumma = strToInt32(itr->second);
    itr = addParams.find("pipScale");
    if (itr != addParams.end())
        pipParams.scaleIndex = pipScaleFromStr(itr->second);
    rez->setPipParams(pipParams);

    if (!mplsInfo.empty() && dynamic_cast<SimplePacketizerReader*>(rez))
        dynamic_cast<SimplePacketizerReader*>(rez)->setMPLSInfo(mplsInfo);

    return rez;
}